

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcItem * isSelfJoinView(SrcList *pTabList,SrcItem *pThis,int iFirst,int iEnd)

{
  Select *pSVar1;
  Schema *pSVar2;
  Select *pSVar3;
  int iVar4;
  long lVar5;
  SrcItem *pSVar6;
  
  pSVar1 = ((pThis->u4).pSubq)->pSelect;
  if ((pSVar1->selFlags & 0x1000000) == 0) {
    do {
      lVar5 = (long)iFirst;
      pSVar6 = pTabList->a + lVar5;
      while( true ) {
        iFirst = iFirst + 1;
        if (iEnd <= lVar5) goto LAB_0017fb21;
        if (((((*(ushort *)&(pSVar6->fg).field_0x1 & 0x44) == 4) && (pSVar6->zName != (char *)0x0))
            && (pSVar2 = pSVar6->pSTab->pSchema, pSVar2 == pThis->pSTab->pSchema)) &&
           ((iVar4 = sqlite3_stricmp(pSVar6->zName,pThis->zName), iVar4 == 0 &&
            ((pSVar3 = ((pSVar6->u4).pSubq)->pSelect, pSVar2 != (Schema *)0x0 ||
             (pSVar1->selId == pSVar3->selId)))))) break;
        pSVar6 = pSVar6 + 1;
        lVar5 = lVar5 + 1;
      }
    } while ((pSVar3->selFlags & 0x1000000) != 0);
  }
  else {
LAB_0017fb21:
    pSVar6 = (SrcItem *)0x0;
  }
  return pSVar6;
}

Assistant:

static SrcItem *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  SrcItem *pThis,              /* Search for prior reference to this subquery */
  int iFirst, int iEnd        /* Range of FROM-clause entries to search. */
){
  SrcItem *pItem;
  Select *pSel;
  assert( pThis->fg.isSubquery );
  pSel = pThis->u4.pSubq->pSelect;
  assert( pSel!=0 );
  if( pSel->selFlags & SF_PushDown ) return 0;
  while( iFirst<iEnd ){
    Select *pS1;
    pItem = &pTabList->a[iFirst++];
    if( !pItem->fg.isSubquery ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    assert( pItem->pSTab!=0 );
    assert( pThis->pSTab!=0 );
    if( pItem->pSTab->pSchema!=pThis->pSTab->pSchema ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    pS1 = pItem->u4.pSubq->pSelect;
    if( pItem->pSTab->pSchema==0 && pSel->selId!=pS1->selId ){
      /* The query flattener left two different CTE tables with identical
      ** names in the same FROM clause. */
      continue;
    }
    if( pS1->selFlags & SF_PushDown ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}